

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_cepstrum_to_mlsa_digital_filter_coefficients.cc
# Opt level: O2

bool __thiscall
sptk::MelCepstrumToMlsaDigitalFilterCoefficients::Run
          (MelCepstrumToMlsaDigitalFilterCoefficients *this,
          vector<double,_std::allocator<double>_> *mel_cepstrum,
          vector<double,_std::allocator<double>_> *mlsa_digital_filter_coefficients)

{
  uint uVar1;
  pointer __src;
  pointer pdVar2;
  long lVar3;
  ulong uVar4;
  size_t __n;
  bool bVar5;
  size_type __new_size;
  
  if (this->is_valid_ == true) {
    bVar5 = false;
    if (mlsa_digital_filter_coefficients != (vector<double,_std::allocator<double>_> *)0x0) {
      lVar3 = (long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      __new_size = lVar3 >> 3;
      bVar5 = false;
      if (__new_size == (long)this->num_order_ + 1U) {
        if ((long)(mlsa_digital_filter_coefficients->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(mlsa_digital_filter_coefficients->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start != lVar3) {
          std::vector<double,_std::allocator<double>_>::resize
                    (mlsa_digital_filter_coefficients,__new_size);
        }
        __src = (mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
        if ((this->alpha_ != 0.0) || (NAN(this->alpha_))) {
          pdVar2 = (mlsa_digital_filter_coefficients->
                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar1 = this->num_order_;
          pdVar2[(int)uVar1] = __src[(int)uVar1];
          for (uVar4 = (ulong)uVar1; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
            pdVar2[uVar4 - 1] = __src[uVar4 - 1] - this->alpha_ * pdVar2[uVar4];
          }
          bVar5 = true;
        }
        else {
          bVar5 = true;
          __n = (long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)__src;
          if (__n != 0) {
            memmove((mlsa_digital_filter_coefficients->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start,__src,__n);
          }
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool MelCepstrumToMlsaDigitalFilterCoefficients::Run(
    const std::vector<double>& mel_cepstrum,
    std::vector<double>* mlsa_digital_filter_coefficients) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ || mel_cepstrum.size() != static_cast<std::size_t>(length) ||
      NULL == mlsa_digital_filter_coefficients) {
    return false;
  }

  // Prepare memories.
  if (mlsa_digital_filter_coefficients->size() !=
      static_cast<std::size_t>(length)) {
    mlsa_digital_filter_coefficients->resize(length);
  }

  // There is no need to convert input when alpha is zero.
  if (0.0 == alpha_) {
    std::copy(mel_cepstrum.begin(), mel_cepstrum.end(),
              mlsa_digital_filter_coefficients->begin());
    return true;
  }

  const double* c(&(mel_cepstrum[0]));
  double* b(&((*mlsa_digital_filter_coefficients)[0]));

  // Apply recursive formula.
  b[num_order_] = c[num_order_];
  for (int m(num_order_ - 1); 0 <= m; --m) {
    b[m] = c[m] - alpha_ * b[m + 1];
  }

  return true;
}